

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessHadOutput
          (BuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,StringRef data)

{
  void *pvVar1;
  value_type *pvVar2;
  unique_lock<std::mutex> lock;
  uint64_t local_40;
  unique_lock<std::mutex> local_38;
  
  pvVar1 = this->impl;
  local_40 = handle.id;
  std::unique_lock<std::mutex>::unique_lock(&local_38,(mutex_type *)((long)pvVar1 + 0x50));
  pvVar2 = llvm::
           DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)((long)pvVar1 + 0x38),&local_40);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             &(pvVar2->
              super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ).second,
             (const_iterator)
             (pvVar2->
             super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             .second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,data.Data,data.Data + data.Length);
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessHadOutput(Command* command, ProcessHandle handle,
                        StringRef data) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // Append to the output buffer.
  auto& buffer = impl->processOutputBuffers[handle.id];
  buffer.insert(buffer.end(), data.begin(), data.end());
}